

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall asl::String::trimmed(String *__return_storage_ptr__,String *this)

{
  byte bVar1;
  anon_union_16_2_78e7fdac_for_String_2 *paVar2;
  uint j;
  ulong uVar3;
  uint i;
  ulong uVar4;
  
  j = this->_len;
  uVar3 = (ulong)j;
  if (this->_size == 0) {
    paVar2 = &this->field_2;
  }
  else {
    paVar2 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  if ((int)j < 1) {
    i = 0;
  }
  else {
    uVar4 = 0;
    do {
      bVar1 = paVar2->_space[uVar4];
      if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
         ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
        i = (uint)uVar4;
        if ((int)j <= (int)i) goto LAB_0011a911;
        goto LAB_0011a8e8;
      }
      uVar4 = uVar4 + 1;
      i = j;
    } while (uVar3 != uVar4);
  }
  goto LAB_0011a915;
LAB_0011a911:
  j = (uint)uVar3;
  goto LAB_0011a915;
  while (uVar3 = uVar3 - 1, j = i, (long)uVar4 < (long)uVar3) {
LAB_0011a8e8:
    bVar1 = paVar2->_space[uVar3 - 1];
    if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
       ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) goto LAB_0011a911;
  }
LAB_0011a915:
  substring(__return_storage_ptr__,this,i,j);
  return __return_storage_ptr__;
}

Assistant:

String String::trimmed() const
{
	int i,j, n=_len;
	const char* s = str();
	for(i=0; i<n; i++)
		if(!myisspace(s[i])) break;
	for(j=n-1; j>=i; j--)
		if(!myisspace(s[j])) break;
	return substring(i, j+1);
}